

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_> *
__thiscall
cmGeneratorTarget::GetAllConfigSources
          (vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,SourceKind kind)

{
  pointer pAVar1;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *pvVar2;
  AllConfigSource *source;
  pointer __x;
  
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = GetAllConfigSources(this);
  pAVar1 = (pvVar2->
           super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (pvVar2->
             super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != pAVar1; __x = __x + 1) {
    if (__x->Kind == kind) {
      std::
      vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
      ::push_back(__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGeneratorTarget::AllConfigSource>
cmGeneratorTarget::GetAllConfigSources(SourceKind kind) const
{
  std::vector<AllConfigSource> result;
  for (AllConfigSource const& source : this->GetAllConfigSources()) {
    if (source.Kind == kind) {
      result.push_back(source);
    }
  }
  return result;
}